

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::MasteringMetadata::SetChromaticity
          (MasteringMetadata *this,PrimaryChromaticity *r,PrimaryChromaticity *g,
          PrimaryChromaticity *b,PrimaryChromaticity *white_point)

{
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> _Var1;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> _Var2;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> _Var3;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> _Var4;
  bool bVar5;
  PrimaryChromaticityPtr wp_ptr;
  PrimaryChromaticityPtr b_ptr;
  PrimaryChromaticityPtr g_ptr;
  PrimaryChromaticityPtr r_ptr;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_40;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_38;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_30;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_28;
  
  local_28._M_head_impl = (PrimaryChromaticity *)0x0;
  if (r != (PrimaryChromaticity *)0x0) {
    bVar5 = anon_unknown_12::CopyChromaticity(r,(PrimaryChromaticityPtr *)&local_28);
    if (!bVar5) {
      bVar5 = false;
      goto LAB_001533fd;
    }
  }
  local_30._M_head_impl = (PrimaryChromaticity *)0x0;
  if (g == (PrimaryChromaticity *)0x0) {
LAB_00153346:
    local_38._M_head_impl = (PrimaryChromaticity *)0x0;
    if (b == (PrimaryChromaticity *)0x0) {
LAB_00153365:
      local_40._M_head_impl = (PrimaryChromaticity *)0x0;
      if (white_point == (PrimaryChromaticity *)0x0) {
LAB_00153384:
        _Var4._M_head_impl = local_28._M_head_impl;
        _Var3._M_head_impl = local_30._M_head_impl;
        _Var2._M_head_impl = local_38._M_head_impl;
        _Var1._M_head_impl = local_40._M_head_impl;
        local_28._M_head_impl = (PrimaryChromaticity *)0x0;
        this->r_ = _Var4._M_head_impl;
        local_30._M_head_impl = (PrimaryChromaticity *)0x0;
        this->g_ = _Var3._M_head_impl;
        local_38._M_head_impl = (PrimaryChromaticity *)0x0;
        this->b_ = _Var2._M_head_impl;
        local_40._M_head_impl = (PrimaryChromaticity *)0x0;
        this->white_point_ = _Var1._M_head_impl;
        bVar5 = true;
      }
      else {
        bVar5 = anon_unknown_12::CopyChromaticity(white_point,(PrimaryChromaticityPtr *)&local_40);
        if (bVar5) goto LAB_00153384;
        bVar5 = false;
      }
      if (local_40._M_head_impl != (PrimaryChromaticity *)0x0) {
        operator_delete(local_40._M_head_impl);
      }
    }
    else {
      bVar5 = anon_unknown_12::CopyChromaticity(b,(PrimaryChromaticityPtr *)&local_38);
      if (bVar5) goto LAB_00153365;
      bVar5 = false;
    }
    if (local_38._M_head_impl != (PrimaryChromaticity *)0x0) {
      operator_delete(local_38._M_head_impl);
    }
  }
  else {
    bVar5 = anon_unknown_12::CopyChromaticity(g,(PrimaryChromaticityPtr *)&local_30);
    if (bVar5) goto LAB_00153346;
    bVar5 = false;
  }
  if (local_30._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(local_30._M_head_impl);
  }
LAB_001533fd:
  if (local_28._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(local_28._M_head_impl);
  }
  return bVar5;
}

Assistant:

bool MasteringMetadata::SetChromaticity(
    const PrimaryChromaticity* r, const PrimaryChromaticity* g,
    const PrimaryChromaticity* b, const PrimaryChromaticity* white_point) {
  PrimaryChromaticityPtr r_ptr(nullptr);
  if (r) {
    if (!CopyChromaticity(r, &r_ptr))
      return false;
  }
  PrimaryChromaticityPtr g_ptr(nullptr);
  if (g) {
    if (!CopyChromaticity(g, &g_ptr))
      return false;
  }
  PrimaryChromaticityPtr b_ptr(nullptr);
  if (b) {
    if (!CopyChromaticity(b, &b_ptr))
      return false;
  }
  PrimaryChromaticityPtr wp_ptr(nullptr);
  if (white_point) {
    if (!CopyChromaticity(white_point, &wp_ptr))
      return false;
  }

  r_ = r_ptr.release();
  g_ = g_ptr.release();
  b_ = b_ptr.release();
  white_point_ = wp_ptr.release();
  return true;
}